

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcIntersect16(int *valid,RTCScene hscene,RTCRayHit16 *rayhit,RTCIntersectArguments *args)

{
  long lVar1;
  RayHit ray1;
  RayQueryContext context;
  RTCRayQueryContext defaultContext;
  RTCIntersectArguments local_50;
  
  if (args == (RTCIntersectArguments *)0x0) {
    args = &local_50;
    local_50.flags = RTC_RAY_QUERY_FLAG_INCOHERENT;
    local_50.feature_mask = RTC_FEATURE_FLAG_ALL;
    local_50.context = (RTCRayQueryContext *)0x0;
    local_50.filter = (RTCFilterFunctionN)0x0;
    local_50.intersect = (RTCIntersectFunctionN)0x0;
  }
  else {
    context.user = args->context;
    if (context.user != (RTCRayQueryContext *)0x0) goto LAB_0018580f;
  }
  context.user = &defaultContext;
  defaultContext.instID[0] = 0xffffffff;
  defaultContext.instPrimID[0] = 0xffffffff;
LAB_0018580f:
  context.scene = (Scene *)hscene;
  context.args = args;
  if (*(long *)(hscene + 0x138) == 0) {
    for (lVar1 = -0x40; lVar1 != 0; lVar1 = lVar1 + 4) {
      if (*(int *)((long)valid + lVar1 + 0x40) != 0) {
        ray1.super_RayK<1>.org.field_0.m128[0] = *(float *)((long)(rayhit->ray).org_y + lVar1);
        ray1.super_RayK<1>.org.field_0.m128[1] = *(float *)((long)(rayhit->ray).org_z + lVar1);
        ray1.super_RayK<1>.org.field_0.m128[2] = *(float *)((long)(rayhit->ray).tnear + lVar1);
        ray1.super_RayK<1>.org.field_0.m128[3] = *(float *)((long)(rayhit->ray).dir_x + lVar1);
        ray1.super_RayK<1>.dir.field_0.m128[0] = *(float *)((long)(rayhit->ray).dir_y + lVar1);
        ray1.super_RayK<1>.dir.field_0.m128[1] = *(float *)((long)(rayhit->ray).dir_z + lVar1);
        ray1.super_RayK<1>.dir.field_0.m128[2] = *(float *)((long)(rayhit->ray).time + lVar1);
        ray1.super_RayK<1>.tfar = *(float *)((long)(rayhit->ray).mask + lVar1);
        ray1.super_RayK<1>.dir.field_0.m128[3] = *(float *)((long)(rayhit->ray).tfar + lVar1);
        ray1.super_RayK<1>.mask = *(int *)((long)(rayhit->ray).id + lVar1);
        ray1.super_RayK<1>.id = *(int *)((long)(rayhit->ray).flags + lVar1);
        ray1.super_RayK<1>.flags = *(int *)((long)(rayhit->hit).Ng_x + lVar1);
        ray1.Ng.field_0.field_0.x = *(float *)((long)(rayhit->hit).Ng_y + lVar1);
        ray1.Ng.field_0.field_0.y = *(float *)((long)(rayhit->hit).Ng_z + lVar1);
        ray1.Ng.field_0.field_0.z = *(float *)((long)(rayhit->hit).u + lVar1);
        ray1.u = *(float *)((long)(rayhit->hit).v + lVar1);
        ray1.v = *(float *)((long)(rayhit->hit).primID + lVar1);
        ray1.primID = *(uint *)((long)(rayhit->hit).geomID + lVar1);
        ray1.geomID = *(uint *)((long)(rayhit->hit).instID[0] + lVar1);
        ray1.instID[0] = *(uint *)((long)(rayhit->hit).instPrimID[0] + lVar1);
        ray1.instPrimID[0] = *(uint *)((long)rayhit[1].ray.org_x + lVar1);
        (**(code **)(hscene + 0x78))(hscene + 0x58,&ray1,&context);
        *(float *)((long)(rayhit->ray).org_y + lVar1) = ray1.super_RayK<1>.org.field_0.m128[0];
        *(float *)((long)(rayhit->ray).org_z + lVar1) = ray1.super_RayK<1>.org.field_0.m128[1];
        *(float *)((long)(rayhit->ray).tnear + lVar1) = ray1.super_RayK<1>.org.field_0.m128[2];
        *(float *)((long)(rayhit->ray).dir_x + lVar1) = ray1.super_RayK<1>.org.field_0.m128[3];
        *(float *)((long)(rayhit->ray).dir_y + lVar1) = ray1.super_RayK<1>.dir.field_0.m128[0];
        *(float *)((long)(rayhit->ray).dir_z + lVar1) = ray1.super_RayK<1>.dir.field_0.m128[1];
        *(float *)((long)(rayhit->ray).time + lVar1) = ray1.super_RayK<1>.dir.field_0.m128[2];
        *(float *)((long)(rayhit->ray).tfar + lVar1) = ray1.super_RayK<1>.dir.field_0.m128[3];
        *(float *)((long)(rayhit->ray).mask + lVar1) = ray1.super_RayK<1>.tfar;
        *(int *)((long)(rayhit->ray).id + lVar1) = ray1.super_RayK<1>.mask;
        *(int *)((long)(rayhit->ray).flags + lVar1) = ray1.super_RayK<1>.id;
        *(int *)((long)(rayhit->hit).Ng_x + lVar1) = ray1.super_RayK<1>.flags;
        *(float *)((long)(rayhit->hit).Ng_y + lVar1) = ray1.Ng.field_0.field_0.x;
        *(float *)((long)(rayhit->hit).Ng_z + lVar1) = ray1.Ng.field_0.field_0.y;
        *(float *)((long)(rayhit->hit).u + lVar1) = ray1.Ng.field_0.field_0.z;
        *(float *)((long)(rayhit->hit).v + lVar1) = ray1.u;
        *(float *)((long)(rayhit->hit).primID + lVar1) = ray1.v;
        *(uint *)((long)(rayhit->hit).geomID + lVar1) = ray1.primID;
        *(uint *)((long)(rayhit->hit).instID[0] + lVar1) = ray1.geomID;
        *(uint *)((long)(rayhit->hit).instPrimID[0] + lVar1) = ray1.instID[0];
        *(uint *)((long)rayhit[1].ray.org_x + lVar1) = ray1.instPrimID[0];
      }
    }
  }
  else {
    (**(code **)(hscene + 0x128))(valid,hscene + 0x58,rayhit,&context);
  }
  return;
}

Assistant:

RTC_API void rtcIntersect16 (const int* valid, RTCScene hscene, RTCRayHit16* rayhit, RTCIntersectArguments* args) 
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcIntersect16);

#if defined(DEBUG)
    RTC_VERIFY_HANDLE(hscene);
    if (scene->isModified()) throw_RTCError(RTC_ERROR_INVALID_OPERATION,"scene not committed");
    if (((size_t)valid) & 0x3F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "mask not aligned to 64 bytes");   
    if (((size_t)rayhit)   & 0x3F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "rayhit not aligned to 64 bytes");   
#endif
    STAT(size_t cnt=0; for (size_t i=0; i<16; i++) cnt += ((int*)valid)[i] == -1;);
    STAT3(normal.travs,cnt,cnt,cnt);

    RTCIntersectArguments defaultArgs;
    if (unlikely(args == nullptr)) {
      rtcInitIntersectArguments(&defaultArgs);
      args = &defaultArgs;
    }
    RTCRayQueryContext* user_context = args->context;
    
    RTCRayQueryContext defaultContext;
    if (unlikely(user_context == nullptr)) {
      rtcInitRayQueryContext(&defaultContext);
      user_context = &defaultContext;
    }
    RayQueryContext context(scene,user_context,args);

    if (likely(scene->intersectors.intersector16))
      scene->intersectors.intersect16(valid,*rayhit,&context);

    else {
      RayHit16* ray16 = (RayHit16*) rayhit;
      for (size_t i=0; i<16; i++) {
        if (!valid[i]) continue;
        RayHit ray1; ray16->get(i,ray1);
        scene->intersectors.intersect((RTCRayHit&)ray1,&context);
        ray16->set(i,ray1);
      }
    }

    RTC_CATCH_END2(scene);
  }